

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_count_gt.cpp
# Opt level: O3

void __thiscall
IsingFreeEnergy_SquareCount0_Test::~IsingFreeEnergy_SquareCount0_Test
          (IsingFreeEnergy_SquareCount0_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IsingFreeEnergy, SquareCount0) {
  typedef double real_t;
  unsigned Lx = 4;
  unsigned Ly = 4;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto vars = boost::math::differentiation::make_ftuple<real_t, 2, 2>(1 / t, 0);
  auto& beta = std::get<0>(vars);
  auto& h = std::get<1>(vars);
  auto f = square::finite_count(Lx, Ly, Jx, Jy, beta, h);
  EXPECT_DOUBLE_EQ(-4.087359662653047e+00, free_energy(f, beta, h));
  EXPECT_DOUBLE_EQ(-3.994108759068211e+00, energy(f, beta, h));
  EXPECT_DOUBLE_EQ(2.452622208849045e-02, specific_heat(f, beta, h));
  EXPECT_DOUBLE_EQ(1.597700713244840e+01, magnetization2(f, beta, h));
}